

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool __thiscall
tinyusdz::Xformable::EvaluateXformOps
          (Xformable *this,double t,TimeSampleInterpolationType tinterp,matrix4d *out_matrix,
          bool *resetXformStack,string *err)

{
  char *pcVar1;
  pointer pcVar2;
  vtable_type *pvVar3;
  double dVar4;
  double dVar5;
  undefined1 *puVar6;
  unkbyte9 Var7;
  undefined1 auVar8 [13];
  undefined5 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  long lVar22;
  double *pdVar23;
  undefined1 *puVar24;
  undefined8 uVar25;
  uint *args;
  uint *puVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  ulong uVar29;
  mat<double,_4,_4> *a;
  undefined1 uVar30;
  pointer pXVar31;
  long lVar32;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar33;
  size_type *psVar34;
  matrix4d *pmVar35;
  double *pdVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  string *args_1;
  bool bVar38;
  byte bVar39;
  float fVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  undefined1 auVar47 [16];
  XformEvaluator eval;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  optional<tinyusdz::value::quatf> f;
  value_type x;
  optional<tinyusdz::value::quath> h;
  matrix4d cm;
  bool local_4d1;
  undefined8 local_4c8;
  double local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_468;
  undefined4 uStack_458;
  undefined4 uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  undefined4 uStack_434;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  double local_3d0;
  double local_3c8;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  undefined1 local_398 [7];
  undefined1 uStack_391;
  undefined1 auStack_390 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_388 [3];
  undefined8 uStack_328;
  undefined8 local_320;
  bool local_318;
  double local_308;
  double local_300;
  double local_2f8;
  undefined1 local_2f0 [40];
  undefined3 uStack_2c8;
  undefined8 uStack_2c5;
  undefined8 local_2bd;
  undefined8 uStack_2b5;
  float local_2ac;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  undefined1 local_288 [4];
  undefined1 auStack_284 [28];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  double local_240;
  Xformable *local_238;
  ulong local_230;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  storage_union local_200;
  vtable_type *local_1f0;
  bool local_1e8;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_1e0;
  bool local_1c8;
  bool local_1c0;
  char local_1b2;
  quath local_1b0;
  double local_1a8 [17];
  double local_120;
  undefined8 local_118;
  undefined8 local_110;
  double local_108;
  double local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  double local_e8;
  double local_e0;
  bool *local_d8;
  matrix4d *local_d0;
  undefined1 local_c8 [16];
  matrix4d local_b8;
  
  bVar39 = 0;
  local_238 = this;
  local_b8.m[1][2] = 0.0;
  local_b8.m[1][3] = 0.0;
  local_b8.m[2][0] = 0.0;
  local_b8.m[2][1] = 0.0;
  local_b8.m[1][0] = 0.0;
  local_b8.m[1][1] = 0.0;
  local_b8.m[0][2] = 0.0;
  local_b8.m[0][3] = 0.0;
  local_b8.m[3][2] = 0.0;
  local_b8.m[3][3] = 0.0;
  local_b8.m[2][2] = 0.0;
  local_b8.m[2][3] = 0.0;
  local_b8.m[3][0] = 0.0;
  local_b8.m[3][1] = 0.0;
  local_b8.m[0][0] = 0.0;
  local_b8.m[0][1] = 0.0;
  lVar22 = 0;
  do {
    *(undefined8 *)((long)local_b8.m[0] + lVar22) = 0x3ff0000000000000;
    lVar22 = lVar22 + 0x28;
  } while (lVar22 != 0xa0);
  pXVar31 = (this->xformOps).
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_4d1 = (this->xformOps).
              super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
              super__Vector_impl_data._M_finish == pXVar31;
  local_d0 = out_matrix;
  if (!local_4d1) {
    uVar29 = 0;
    local_3bc = (uint)CONCAT71((int7)((ulong)this >> 8),local_4d1);
    args_1 = err;
    local_3b8 = local_3bc;
    local_3b4 = local_3bc;
    local_3b0 = local_3bc;
    local_3ac = local_3bc;
    local_3a8 = local_3bc;
    local_3a4 = local_3bc;
    local_3a0 = local_3bc;
    local_39c = local_3bc;
    local_d8 = resetXformStack;
    do {
      local_228[4] = pXVar31[uVar29].inverted;
      local_228._0_4_ = pXVar31[uVar29].op_type;
      local_220._M_dataplus._M_p = local_228 + 0x18;
      pcVar2 = pXVar31[uVar29].suffix._M_dataplus._M_p;
      local_230 = uVar29;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_228 + 8),pcVar2,pcVar2 + pXVar31[uVar29].suffix._M_string_length);
      local_1f0 = pXVar31[uVar29]._var._value.v_.vtable;
      pvVar3 = pXVar31[uVar29]._var._value.v_.vtable;
      args = (uint *)resetXformStack;
      if (pvVar3 != (vtable_type *)0x0) {
        (*pvVar3->copy)((storage_union *)&pXVar31[uVar29]._var,(storage_union *)(local_228 + 0x28));
        args = (uint *)resetXformStack;
      }
      local_1e8 = pXVar31[uVar29]._var._blocked;
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                *)(local_228 + 0x48),&pXVar31[uVar29]._var._ts._samples);
      uVar17 = local_478._M_allocated_capacity._6_2_;
      uVar15 = local_478._M_allocated_capacity._4_2_;
      uVar13 = local_478._M_allocated_capacity._2_2_;
      uVar11 = local_478._M_local_buf[1];
      uVar30 = local_478._M_local_buf[0];
      local_1c8 = pXVar31[uVar29]._var._ts._dirty;
      local_1c0 = pXVar31[uVar29]._is_blocked;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      local_1a8[3] = 0.0;
      local_1a8[4] = 0.0;
      local_1a8[5] = 0.0;
      local_1a8[6] = 0.0;
      local_1a8[7] = 0.0;
      local_1a8[8] = 0.0;
      local_1a8[9] = 0.0;
      local_1a8[10] = 0.0;
      local_1a8[0xb] = 0.0;
      local_1a8[0xc] = 0.0;
      local_1a8[0xd] = 0.0;
      local_1a8[0xe] = 0.0;
      local_1a8[0xf] = 0.0;
      lVar22 = 0;
      do {
        *(undefined8 *)((long)local_1a8 + lVar22) = 0x3ff0000000000000;
        lVar22 = lVar22 + 0x28;
      } while (lVar22 != 0xa0);
      local_478._M_local_buf[0] = uVar30;
      local_478._M_local_buf[1] = uVar11;
      local_478._M_allocated_capacity._2_2_ = uVar13;
      local_478._M_allocated_capacity._4_2_ = uVar15;
      local_478._M_allocated_capacity._6_2_ = uVar17;
      if (ResetXformStack < (uint)local_228._0_4_) goto LAB_00327300;
      args = &switchD_00326141::switchdataD_003c7be8;
      paVar27 = &local_478;
      local_478._M_local_buf[0] = (char)&aStack_468;
      uVar10 = local_478._M_local_buf[0];
      local_478._M_local_buf[1] = (char)((ulong)&aStack_468 >> 8);
      uVar12 = local_478._M_local_buf[1];
      local_478._M_allocated_capacity._2_2_ = (undefined2)((ulong)&aStack_468 >> 0x10);
      uVar14 = local_478._M_allocated_capacity._2_2_;
      local_478._M_allocated_capacity._4_2_ = (undefined2)((ulong)&aStack_468 >> 0x20);
      uVar16 = local_478._M_allocated_capacity._4_2_;
      local_478._M_allocated_capacity._6_2_ = (undefined2)((ulong)&aStack_468 >> 0x30);
      uVar18 = local_478._M_allocated_capacity._6_2_;
      switch(local_228._0_4_) {
      case 0:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<tinyusdz::value::matrix4f>
                  ((optional<tinyusdz::value::matrix4f> *)paVar27,(XformOp *)local_228,t,tinterp);
        uVar20 = uStack_43c;
        uVar19 = uStack_448;
        if (local_478._M_local_buf[0] == '\x01') {
          local_2bd = CONCAT44(local_440,uStack_444);
          uStack_2b5 = CONCAT44(uStack_438,uStack_43c);
          local_2f0._36_4_ = (undefined4)(CONCAT44(uStack_450,uStack_454) >> 8);
          uStack_2c8 = (undefined3)(uStack_450 >> 8);
          uStack_2c5 = CONCAT44(uStack_448,uStack_44c);
          local_2f0._19_5_ =
               (undefined5)CONCAT44(aStack_468._8_4_,aStack_468._M_allocated_capacity._4_4_);
          local_2f0[0x1b] = (undefined1)aStack_468._12_4_;
          local_2f0._24_4_ = CONCAT13(local_2f0[0x1b],(int3)((uint)aStack_468._8_4_ >> 8));
          local_2f0._28_4_ = (undefined4)(CONCAT44(uStack_458,aStack_468._12_4_) >> 8);
          local_2f0._32_3_ = (undefined3)((uint)uStack_458 >> 8);
          local_2f0._32_4_ = CONCAT13((char)uStack_454,local_2f0._32_3_);
          local_2f0._3_5_ =
               (undefined5)
               CONCAT44(local_478._8_4_,
                        CONCAT22(local_478._M_allocated_capacity._6_2_,
                                 local_478._M_allocated_capacity._4_2_));
          local_2f0._8_3_ = (undefined3)((uint)local_478._8_4_ >> 8);
          local_2f0._11_5_ =
               (undefined5)CONCAT44(aStack_468._M_allocated_capacity._0_4_,local_478._12_4_);
          local_2f0[0x10] = (undefined1)((uint)aStack_468._0_4_ >> 8);
          local_2f0._17_2_ = (undefined2)((uint)aStack_468._0_4_ >> 0x10);
          Var7 = CONCAT45(local_2f0._24_4_,local_2f0._19_5_);
          auVar8._9_4_ = local_2f0._28_4_;
          auVar8._0_9_ = Var7;
          auVar47._13_3_ = local_2f0._32_3_;
          auVar47._0_13_ = auVar8;
          uVar9 = CONCAT41(local_2f0._36_4_,(char)uStack_454);
          uStack_458 = (int)uVar9;
          uStack_448 = uStack_444;
          uStack_444 = local_440;
          local_440 = uStack_43c;
          uStack_43c = uStack_438;
          uStack_454 = (undefined4)(CONCAT35(uStack_2c8,uVar9) >> 0x20);
          uStack_450 = uStack_44c;
          uStack_44c = uVar19;
          aStack_468._M_allocated_capacity._0_4_ = aStack_468._M_allocated_capacity._4_4_;
          aStack_468._M_allocated_capacity._4_4_ = (undefined4)((unkuint9)Var7 >> 0x20);
          aStack_468._8_4_ = auVar8._8_4_;
          aStack_468._12_4_ = auVar47._12_4_;
          local_478._M_local_buf[0] = (char)local_478._M_allocated_capacity._4_2_;
          local_478._M_local_buf[1] = (char)((ushort)local_478._4_2_ >> 8);
          local_478._M_allocated_capacity._2_2_ = local_478._M_allocated_capacity._6_2_;
          local_478._M_allocated_capacity._4_2_ =
               (undefined2)(CONCAT35(local_2f0._8_3_,local_2f0._3_5_) >> 0x20);
          local_478._M_allocated_capacity._6_2_ = (undefined2)((uint)local_478._8_4_ >> 0x10);
          local_478._8_4_ = local_478._12_4_;
          local_478._12_4_ =
               (undefined4)
               (CONCAT26(local_2f0._17_2_,CONCAT15(local_2f0[0x10],local_2f0._11_5_)) >> 0x20);
          pdVar23 = local_1a8;
          lVar22 = 0;
          do {
            lVar32 = 0;
            do {
              pdVar23[lVar32] = (double)*(float *)((long)paVar27 + lVar32 * 4);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 4);
            lVar22 = lVar22 + 1;
            paVar27 = paVar27 + 1;
            pdVar23 = pdVar23 + 4;
            args = (uint *)paVar27;
            in_XMM3_Dc = uVar20;
            in_XMM3_Dd = uStack_438;
          } while (lVar22 != 4);
        }
        else {
          XformOp::get_value<tinyusdz::value::matrix4d>
                    ((optional<tinyusdz::value::matrix4d> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          if (local_478._M_local_buf[0] == '\x01') {
            memcpy(&uStack_391,local_478._M_local_buf + 8,0x80);
            memcpy(local_1a8,&uStack_391,0x80);
          }
          else if (err != (string *)0x0) {
            ::std::__cxx11::string::append((char *)err);
          }
          if (uVar30 == '\0') break;
        }
        if (local_228[4] != false) {
          pdVar23 = local_1a8;
          paVar27 = &local_478;
          for (args = (uint *)0x10;
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              args = (uint *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)args + -0x20))->field_2 + 0xf)) {
            paVar27->_M_allocated_capacity = (size_type)*pdVar23;
            pdVar23 = pdVar23 + (ulong)bVar39 * -2 + 1;
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar27 + (ulong)bVar39 * -0x10 + 8);
          }
          dVar4 = linalg::determinant<double>((mat<double,_4,_4> *)&local_478);
          local_4c8._0_4_ = SUB84(dVar4,0);
          local_4c8._4_4_ = (uint)((ulong)dVar4 >> 0x20) & 0x7fffffff;
          if (ABS(dVar4) <= 1e-09 && ABS(dVar4) != 1e-09) {
            puVar24 = auStack_390 + 8;
            if (err != (string *)0x0) {
              local_4c8 = ABS(dVar4);
              if (local_220._M_string_length == 0) {
                ::std::__cxx11::string::append((char *)err);
              }
              else {
                local_398[0] = SUB81(puVar24,0);
                local_398[1] = (undefined1)((ulong)puVar24 >> 8);
                local_398._2_2_ = (undefined2)((ulong)puVar24 >> 0x10);
                stack0xfffffffffffffc6c = (undefined4)((ulong)puVar24 >> 0x20);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_398,
                           "`xformOp:transform:{}` is singular matrix and cannot be inverted.\n","")
                ;
                fmt::format<std::__cxx11::string>
                          ((string *)&local_478,(fmt *)local_398,(string *)(local_228 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                ::std::__cxx11::string::_M_append
                          ((char *)err,
                           CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0])))));
                paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                      CONCAT24(local_478._M_allocated_capacity._4_2_,
                                               CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                        CONCAT11(local_478._M_local_buf[1],
                                                                 local_478._M_local_buf[0]))));
                if (paVar27 != &aStack_468) {
                  operator_delete(paVar27,CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                                   aStack_468._M_allocated_capacity._0_4_) + 1);
                }
                puVar24 = (undefined1 *)
                          CONCAT44(stack0xfffffffffffffc6c,
                                   CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0])));
                if (puVar24 != auStack_390 + 8) {
                  operator_delete(puVar24,CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                                   abStack_388[0]._M_dataplus._M_p._0_4_) + 1);
                }
              }
            }
          }
          else {
            pdVar23 = local_1a8;
            paVar27 = &local_478;
            for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
              paVar27->_M_allocated_capacity = (size_type)*pdVar23;
              pdVar23 = pdVar23 + (ulong)bVar39 * -2 + 1;
              paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar27 + (ulong)bVar39 * -0x10 + 8);
            }
            local_4c8 = ABS(dVar4);
            linalg::inverse<double,4>
                      ((mat<double,_4,_4> *)local_398,(linalg *)local_478._M_local_buf,a);
            local_1a8[0] = (double)CONCAT44(stack0xfffffffffffffc6c,
                                            CONCAT22(local_398._2_2_,
                                                     CONCAT11(local_398[1],local_398[0])));
            local_1a8[1] = (double)CONCAT44(auStack_390._4_4_,
                                            CONCAT22(auStack_390._2_2_,auStack_390._0_2_));
            local_1a8[2] = (double)CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                            abStack_388[0]._M_dataplus._M_p._0_4_);
            local_1a8[3] = (double)abStack_388[0]._M_string_length;
            local_1a8[4] = (double)abStack_388[0].field_2._0_8_;
            args = (uint *)(auStack_390 + 8);
            local_1a8[8] = (double)abStack_388[1].field_2._0_8_;
            local_1a8[9] = (double)abStack_388[1].field_2._8_8_;
            local_1a8[6] = (double)abStack_388[1]._M_dataplus._M_p;
            local_1a8[7] = (double)abStack_388[1]._M_string_length;
            local_1a8[0xd] = (double)abStack_388[2].field_2._8_8_;
            local_1a8[0xe] = (double)uStack_328;
            local_1a8[0xb] = (double)abStack_388[2]._M_string_length;
            local_1a8[0xc] = (double)abStack_388[2].field_2._0_8_;
            in_XMM3_Dc = 0;
            in_XMM3_Dd = 0;
            local_1a8[5] = (double)abStack_388[0].field_2._8_8_;
            local_1a8[10] = (double)abStack_388[2]._M_dataplus._M_p;
            local_1a8[0xf] = (double)local_320;
          }
          if ((double)CONCAT44(local_4c8._4_4_,(undefined4)local_4c8) <= 1e-09 &&
              (double)CONCAT44(local_4c8._4_4_,(undefined4)local_4c8) != 1e-09) break;
        }
        goto LAB_00327300;
      case 1:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)
                   &paVar27->_M_allocated_capacity,(XformOp *)local_228,t,tinterp);
        if (local_478._M_local_buf[0] != '\0') {
          local_3ac = (uint)(ushort)local_478._M_allocated_capacity._2_2_;
          local_3b0 = (uint)(ushort)local_478._M_allocated_capacity._4_2_;
          args = (uint *)(ulong)(ushort)local_478._M_allocated_capacity._6_2_;
          local_3b4 = (uint)(ushort)local_478._M_allocated_capacity._6_2_;
        }
        if (local_478._M_local_buf[0] == '\x01') {
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3ac);
          local_258._8_4_ = extraout_XMM0_Dc;
          local_258._0_8_ = (double)fVar40;
          local_258._12_4_ = extraout_XMM0_Dd;
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3b0);
          local_268._8_4_ = extraout_XMM0_Dc_00;
          local_268._0_8_ = (double)fVar40;
          local_268._12_4_ = extraout_XMM0_Dd_00;
          uVar41 = tinyusdz::value::half_to_float((half)(uint16_t)local_3b4);
LAB_003270c3:
          dVar4 = (double)(float)uVar41;
          uVar30 = '\x01';
        }
        else {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar41 = local_298;
          if (local_478._M_local_buf[0] != '\0') {
            local_2a4 = (float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                        local_478._M_allocated_capacity._4_2_);
            uVar41 = local_478._12_4_;
            local_29c = (float)local_478._8_4_;
          }
          local_298 = (float)uVar41;
          if (local_478._M_local_buf[0] == '\x01') {
            local_258._8_8_ = 0;
            local_258._0_8_ = (double)local_2a4;
            local_268._8_8_ = 0;
            local_268._0_8_ = (double)local_29c;
            goto LAB_003270c3;
          }
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          uVar41 = local_478._8_4_;
          uVar42 = local_478._12_4_;
          uVar43 = aStack_468._M_allocated_capacity._0_4_;
          uVar44 = aStack_468._M_allocated_capacity._4_4_;
          uVar45 = aStack_468._8_4_;
          uVar46 = aStack_468._12_4_;
          if (local_478._M_local_buf[0] == '\0') {
            uVar41 = (float)local_118;
            uVar42 = (float)((ulong)local_118 >> 0x20);
            uVar43 = (uint)local_110;
            uVar44 = (uint)((ulong)local_110 >> 0x20);
            uVar45 = SUB84(local_108,0);
            uVar46 = (int)((ulong)local_108 >> 0x20);
          }
          in_XMM3_Dd = 0;
          in_XMM3_Dc = 0;
          dVar4 = (double)CONCAT44(uVar46,uVar45);
          local_110 = CONCAT44(uVar44,uVar43);
          local_118 = CONCAT44(uVar42,uVar41);
          local_108 = dVar4;
          if (local_478._M_local_buf[0] == '\0') {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err);
            }
            dVar4 = local_c8._0_8_;
            in_XMM3_Dc = local_c8._8_4_;
            in_XMM3_Dd = local_c8._12_4_;
          }
          else {
            local_258._4_4_ = uVar42;
            local_258._0_4_ = uVar41;
            local_258._8_8_ = 0;
            local_268._4_4_ = uVar44;
            local_268._0_4_ = uVar43;
            local_268._8_8_ = 0;
          }
        }
        if (uVar30 != '\0') {
          if (local_228[4] != false) {
            local_258._4_4_ = local_258._4_4_ ^ 0x80000000;
            local_258._12_4_ = local_258._12_4_ ^ 0x80000000;
            local_268._4_4_ = local_268._4_4_ ^ 0x80000000;
            local_268._12_4_ = local_268._12_4_ ^ 0x80000000;
            dVar4 = -dVar4;
            in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
          }
          local_1a8[0xc] = (double)CONCAT44(local_258._4_4_,local_258._0_4_);
          local_1a8[0xd] = (double)CONCAT44(local_268._4_4_,local_268._0_4_);
          local_1a8[0xe] = dVar4;
        }
        local_c8._8_4_ = in_XMM3_Dc;
        local_c8._0_8_ = dVar4;
        local_c8._12_4_ = in_XMM3_Dd;
        goto LAB_003272f8;
      case 2:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)
                   &paVar27->_M_allocated_capacity,(XformOp *)local_228,t,tinterp);
        if (local_478._M_local_buf[0] != '\0') {
          local_39c = (uint)(ushort)local_478._M_allocated_capacity._2_2_;
          local_3a0 = (uint)(ushort)local_478._M_allocated_capacity._4_2_;
          args = (uint *)(ulong)(ushort)local_478._M_allocated_capacity._6_2_;
          local_3a4 = (uint)(ushort)local_478._M_allocated_capacity._6_2_;
        }
        if (local_478._M_local_buf[0] == '\x01') {
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_39c);
          local_3c8 = (double)fVar40;
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3a0);
          local_3d0 = (double)fVar40;
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3a4);
LAB_00326d45:
          uVar30 = '\x01';
          local_240 = (double)fVar40;
        }
        else {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          if (local_478._M_local_buf[0] != '\0') {
            local_290 = (float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                        local_478._M_allocated_capacity._4_2_);
            local_2ac = (float)local_478._12_4_;
            local_28c = (float)local_478._8_4_;
          }
          if (local_478._M_local_buf[0] == '\x01') {
            local_3c8 = (double)local_290;
            local_3d0 = (double)local_28c;
            fVar40 = local_2ac;
            goto LAB_00326d45;
          }
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          uVar41 = aStack_468._M_allocated_capacity._0_4_;
          uVar42 = aStack_468._M_allocated_capacity._4_4_;
          uVar43 = local_478._8_4_;
          uVar44 = local_478._12_4_;
          uVar45 = aStack_468._8_4_;
          uVar46 = aStack_468._12_4_;
          if (local_478._M_local_buf[0] == '\0') {
            uVar41 = (uint)local_f0;
            uVar42 = (uint)((ulong)local_f0 >> 0x20);
            uVar43 = (float)local_f8;
            uVar44 = (float)((ulong)local_f8 >> 0x20);
            uVar45 = SUB84(local_e8,0);
            uVar46 = (int)((ulong)local_e8 >> 0x20);
          }
          in_XMM3_Dd = 0;
          in_XMM3_Dc = 0;
          local_e8 = (double)CONCAT44(uVar46,uVar45);
          local_f0 = CONCAT44(uVar42,uVar41);
          local_f8 = CONCAT44(uVar44,uVar43);
          if (local_478._M_local_buf[0] == '\0') {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err);
            }
            in_XMM3_Dc = 0;
            in_XMM3_Dd = 0;
          }
          else {
            local_3d0 = (double)CONCAT44(uVar42,uVar41);
            local_3c8 = (double)CONCAT44(uVar44,uVar43);
            local_240 = local_e8;
          }
        }
        if ((uVar30 != '\0') &&
           (local_1a8[0] = local_3c8, local_1a8[5] = local_3d0, local_1a8[10] = local_240,
           local_228[4] != false)) {
          in_XMM3_Dc = 0;
          in_XMM3_Dd = 0;
          local_3c8 = 1.0 / local_3c8;
          local_3d0 = 1.0 / local_3d0;
          local_240 = 1.0 / local_240;
          local_1a8[0] = local_3c8;
          local_1a8[5] = local_3d0;
          local_1a8[10] = local_240;
        }
        goto LAB_003272f8;
      case 3:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)paVar27,(XformOp *)local_228,t,tinterp);
        if (local_478._M_local_buf[0] != '\0') {
          args = (uint *)(ulong)(ushort)local_478._M_allocated_capacity._2_2_;
          local_3bc = (uint)(ushort)local_478._M_allocated_capacity._2_2_;
        }
        if (local_478._M_local_buf[0] == '\x01') {
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3bc);
LAB_00326e42:
          uVar30 = '\x01';
          dVar4 = (double)fVar40;
        }
        else {
          XformOp::get_value<float>
                    ((optional<float> *)&paVar27->_M_allocated_capacity,(XformOp *)local_228,t,
                     tinterp);
          if (local_478._M_local_buf[0] != '\0') {
            local_2a8 = (float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                        local_478._M_allocated_capacity._4_2_);
          }
          fVar40 = local_2a8;
          if (local_478._M_local_buf[0] == '\x01') goto LAB_00326e42;
          XformOp::get_value<double>((optional<double> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          uVar41 = local_478._8_4_;
          uVar42 = local_478._12_4_;
          if (local_478._M_local_buf[0] == '\0') {
            uVar41 = SUB84(local_120,0);
            uVar42 = (float)((ulong)local_120 >> 0x20);
          }
          puVar24 = auStack_390 + 8;
          local_120 = (double)CONCAT44(uVar42,uVar41);
          dVar4 = local_120;
          if ((local_478._M_local_buf[0] == '\0') && (dVar4 = local_308, err != (string *)0x0)) {
            if (local_220._M_string_length == 0) {
              ::std::__cxx11::string::append((char *)err);
              dVar4 = local_308;
            }
            else {
              local_398[0] = SUB81(puVar24,0);
              local_398[1] = (undefined1)((ulong)puVar24 >> 8);
              local_398._2_2_ = (undefined2)((ulong)puVar24 >> 0x10);
              stack0xfffffffffffffc6c = (undefined4)((ulong)puVar24 >> 0x20);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_398,
                         "`xformOp:rotateX:{}` is not half, float or double type.\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)paVar27,(fmt *)local_398,(string *)(local_228 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              ::std::__cxx11::string::_M_append
                        ((char *)err,
                         CONCAT26(local_478._M_allocated_capacity._6_2_,
                                  CONCAT24(local_478._M_allocated_capacity._4_2_,
                                           CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                    CONCAT11(local_478._M_local_buf[1],
                                                             local_478._M_local_buf[0])))));
              paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0]))));
              if (paVar37 != &aStack_468) {
                operator_delete(paVar37,CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                                 aStack_468._M_allocated_capacity._0_4_) + 1);
              }
              puVar24 = (undefined1 *)
                        CONCAT44(stack0xfffffffffffffc6c,
                                 CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0])));
              dVar4 = local_308;
              if (puVar24 != auStack_390 + 8) {
                operator_delete(puVar24,CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                                 abStack_388[0]._M_dataplus._M_p._0_4_) + 1);
                dVar4 = local_308;
              }
            }
          }
        }
        local_308 = dVar4;
        if (uVar30 == '\0') break;
        local_478._8_4_ = 0.0;
        local_478._12_4_ = 0.0;
        aStack_468._M_allocated_capacity._0_4_ = aStack_468._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        uStack_3e8 = 0;
        local_3e0 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        local_408 = 0;
        uStack_400 = 0;
        local_418 = 0;
        uStack_410 = 0;
        local_428 = 0;
        uStack_420 = 0;
        uStack_438 = 0;
        uStack_434 = 0;
        local_430 = 0;
        uStack_448 = 0;
        uStack_444 = 0;
        local_440 = 0;
        uStack_43c = 0;
        uStack_458 = 0;
        uStack_454 = 0;
        uStack_450 = 0;
        uStack_44c = 0;
        lVar22 = 0x20;
        do {
          *(undefined8 *)((long)&local_478 + lVar22) = 0x3ff0000000000000;
          lVar22 = lVar22 + 0x28;
        } while (lVar22 != 0xc0);
        local_478._M_local_buf[0] = uVar10;
        local_478._M_local_buf[1] = uVar12;
        local_478._M_allocated_capacity._2_2_ = uVar14;
        local_478._M_allocated_capacity._4_2_ = uVar16;
        local_478._M_allocated_capacity._6_2_ = uVar18;
        anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,dVar4);
LAB_00327259:
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_398,paVar27);
        uVar30 = local_318;
        if (local_318 == true) {
          peVar33 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_398;
          pdVar23 = local_1a8;
          for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
            *pdVar23 = (peVar33->contained).
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0.m_value.m[0][0];
            peVar33 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)peVar33 + (ulong)bVar39 * -0x10 + 8);
            pdVar23 = pdVar23 + (ulong)bVar39 * -2 + 1;
          }
          args = (uint *)0x0;
        }
        else if (err != (string *)0x0) {
          ::std::__cxx11::string::_M_append
                    ((char *)err,
                     CONCAT44(stack0xfffffffffffffc6c,
                              CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0]))));
        }
        if ((local_318 == false) &&
           (puVar24 = (undefined1 *)
                      CONCAT44(stack0xfffffffffffffc6c,
                               CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0]))),
           puVar24 != auStack_390 + 8)) {
          operator_delete(puVar24,CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                           abStack_388[0]._M_dataplus._M_p._0_4_) + 1);
        }
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                              CONCAT24(local_478._M_allocated_capacity._4_2_,
                                       CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                CONCAT11(local_478._M_local_buf[1],
                                                         local_478._M_local_buf[0]))));
        if (paVar27 == &aStack_468) goto LAB_003272f8;
        lVar22 = CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                          aStack_468._M_allocated_capacity._0_4_);
        goto LAB_003272f0;
      case 4:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)paVar27,(XformOp *)local_228,t,tinterp);
        if (local_478._M_local_buf[0] != '\0') {
          args = (uint *)(ulong)(ushort)local_478._M_allocated_capacity._2_2_;
          local_3b8 = (uint)(ushort)local_478._M_allocated_capacity._2_2_;
        }
        if (local_478._M_local_buf[0] == '\x01') {
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3b8);
LAB_00326be2:
          uVar30 = '\x01';
          dVar4 = (double)fVar40;
        }
        else {
          XformOp::get_value<float>
                    ((optional<float> *)&paVar27->_M_allocated_capacity,(XformOp *)local_228,t,
                     tinterp);
          if (local_478._M_local_buf[0] != '\0') {
            local_2a0 = (float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                        local_478._M_allocated_capacity._4_2_);
          }
          fVar40 = local_2a0;
          if (local_478._M_local_buf[0] == '\x01') goto LAB_00326be2;
          XformOp::get_value<double>((optional<double> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          uVar41 = local_478._8_4_;
          uVar42 = local_478._12_4_;
          if (local_478._M_local_buf[0] == '\0') {
            uVar41 = SUB84(local_100,0);
            uVar42 = (float)((ulong)local_100 >> 0x20);
          }
          puVar24 = auStack_390 + 8;
          local_100 = (double)CONCAT44(uVar42,uVar41);
          dVar4 = local_100;
          if ((local_478._M_local_buf[0] == '\0') && (dVar4 = local_300, err != (string *)0x0)) {
            if (local_220._M_string_length == 0) {
              ::std::__cxx11::string::append((char *)err);
              dVar4 = local_300;
            }
            else {
              local_398[0] = SUB81(puVar24,0);
              local_398[1] = (undefined1)((ulong)puVar24 >> 8);
              local_398._2_2_ = (undefined2)((ulong)puVar24 >> 0x10);
              stack0xfffffffffffffc6c = (undefined4)((ulong)puVar24 >> 0x20);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_398,
                         "`xformOp:rotateY:{}` is not half, float or double type.\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)paVar27,(fmt *)local_398,(string *)(local_228 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              ::std::__cxx11::string::_M_append
                        ((char *)err,
                         CONCAT26(local_478._M_allocated_capacity._6_2_,
                                  CONCAT24(local_478._M_allocated_capacity._4_2_,
                                           CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                    CONCAT11(local_478._M_local_buf[1],
                                                             local_478._M_local_buf[0])))));
              paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0]))));
              if (paVar37 != &aStack_468) {
                operator_delete(paVar37,CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                                 aStack_468._M_allocated_capacity._0_4_) + 1);
              }
              puVar24 = (undefined1 *)
                        CONCAT44(stack0xfffffffffffffc6c,
                                 CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0])));
              dVar4 = local_300;
              if (puVar24 != auStack_390 + 8) {
                operator_delete(puVar24,CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                                 abStack_388[0]._M_dataplus._M_p._0_4_) + 1);
                dVar4 = local_300;
              }
            }
          }
        }
        local_300 = dVar4;
        if (uVar30 != '\0') {
          local_478._8_4_ = 0.0;
          local_478._12_4_ = 0.0;
          aStack_468._M_allocated_capacity._0_4_ =
               aStack_468._M_allocated_capacity._0_4_ & 0xffffff00;
          uStack_3e8 = 0;
          local_3e0 = 0;
          uStack_3f8 = 0;
          uStack_3f0 = 0;
          local_408 = 0;
          uStack_400 = 0;
          local_418 = 0;
          uStack_410 = 0;
          local_428 = 0;
          uStack_420 = 0;
          uStack_438 = 0;
          uStack_434 = 0;
          local_430 = 0;
          uStack_448 = 0;
          uStack_444 = 0;
          local_440 = 0;
          uStack_43c = 0;
          uStack_458 = 0;
          uStack_454 = 0;
          uStack_450 = 0;
          uStack_44c = 0;
          lVar22 = 0x20;
          do {
            *(undefined8 *)((long)&local_478 + lVar22) = 0x3ff0000000000000;
            lVar22 = lVar22 + 0x28;
          } while (lVar22 != 0xc0);
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,dVar4);
          goto LAB_00327259;
        }
        break;
      case 5:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)paVar27,(XformOp *)local_228,t,tinterp);
        if (local_478._M_local_buf[0] != '\0') {
          args = (uint *)(ulong)(ushort)local_478._M_allocated_capacity._2_2_;
          local_3a8 = (uint)(ushort)local_478._M_allocated_capacity._2_2_;
        }
        if (local_478._M_local_buf[0] == '\x01') {
          fVar40 = tinyusdz::value::half_to_float((half)(uint16_t)local_3a8);
LAB_00327194:
          uVar30 = '\x01';
          dVar4 = (double)fVar40;
        }
        else {
          XformOp::get_value<float>
                    ((optional<float> *)&paVar27->_M_allocated_capacity,(XformOp *)local_228,t,
                     tinterp);
          if (local_478._M_local_buf[0] != '\0') {
            local_294 = (float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                        local_478._M_allocated_capacity._4_2_);
          }
          fVar40 = local_294;
          if (local_478._M_local_buf[0] == '\x01') goto LAB_00327194;
          XformOp::get_value<double>((optional<double> *)paVar27,(XformOp *)local_228,t,tinterp);
          uVar30 = local_478._M_local_buf[0];
          uVar41 = local_478._8_4_;
          uVar42 = local_478._12_4_;
          if (local_478._M_local_buf[0] == '\0') {
            uVar41 = SUB84(local_e0,0);
            uVar42 = (float)((ulong)local_e0 >> 0x20);
          }
          puVar24 = auStack_390 + 8;
          local_e0 = (double)CONCAT44(uVar42,uVar41);
          dVar4 = local_e0;
          if ((local_478._M_local_buf[0] == '\0') && (dVar4 = local_2f8, err != (string *)0x0)) {
            if (local_220._M_string_length == 0) {
              ::std::__cxx11::string::append((char *)err);
              dVar4 = local_2f8;
            }
            else {
              local_398[0] = SUB81(puVar24,0);
              local_398[1] = (undefined1)((ulong)puVar24 >> 8);
              local_398._2_2_ = (undefined2)((ulong)puVar24 >> 0x10);
              stack0xfffffffffffffc6c = (undefined4)((ulong)puVar24 >> 0x20);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_398,
                         "`xformOp:rotateZ:{}` is not half, float or double type.\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)paVar27,(fmt *)local_398,(string *)(local_228 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              ::std::__cxx11::string::_M_append
                        ((char *)err,
                         CONCAT26(local_478._M_allocated_capacity._6_2_,
                                  CONCAT24(local_478._M_allocated_capacity._4_2_,
                                           CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                    CONCAT11(local_478._M_local_buf[1],
                                                             local_478._M_local_buf[0])))));
              paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0]))));
              if (paVar37 != &aStack_468) {
                operator_delete(paVar37,CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                                 aStack_468._M_allocated_capacity._0_4_) + 1);
              }
              puVar24 = (undefined1 *)
                        CONCAT44(stack0xfffffffffffffc6c,
                                 CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0])));
              dVar4 = local_2f8;
              if (puVar24 != auStack_390 + 8) {
                operator_delete(puVar24,CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                                                 abStack_388[0]._M_dataplus._M_p._0_4_) + 1);
                dVar4 = local_2f8;
              }
            }
          }
        }
        local_2f8 = dVar4;
        if (uVar30 != '\0') {
          local_478._8_4_ = 0.0;
          local_478._12_4_ = 0.0;
          aStack_468._M_allocated_capacity._0_4_ =
               aStack_468._M_allocated_capacity._0_4_ & 0xffffff00;
          uStack_3e8 = 0;
          local_3e0 = 0;
          uStack_3f8 = 0;
          uStack_3f0 = 0;
          local_408 = 0;
          uStack_400 = 0;
          local_418 = 0;
          uStack_410 = 0;
          local_428 = 0;
          uStack_420 = 0;
          uStack_438 = 0;
          uStack_434 = 0;
          local_430 = 0;
          uStack_448 = 0;
          uStack_444 = 0;
          local_440 = 0;
          uStack_43c = 0;
          uStack_458 = 0;
          uStack_454 = 0;
          uStack_450 = 0;
          uStack_44c = 0;
          lVar22 = 0x20;
          do {
            *(undefined8 *)((long)&local_478 + lVar22) = 0x3ff0000000000000;
            lVar22 = lVar22 + 0x28;
          } while (lVar22 != 0xc0);
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
          goto LAB_00327259;
        }
        break;
      default:
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)
                   &paVar27->_M_allocated_capacity,(XformOp *)local_228,t,tinterp);
        uVar15 = local_478._M_allocated_capacity._6_2_;
        uVar13 = local_478._M_allocated_capacity._4_2_;
        if (local_478._M_local_buf[0] != '\x01') {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          if (local_478._M_local_buf[0] == '\x01') {
            local_4c8 = (double)(float)CONCAT22(local_478._M_allocated_capacity._6_2_,
                                                local_478._M_allocated_capacity._4_2_);
            local_4b8 = (double)(float)local_478._8_4_;
            dVar4 = (double)(float)local_478._12_4_;
            goto LAB_0032621d;
          }
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)paVar27,(XformOp *)local_228,t,tinterp);
          if (local_478._M_local_buf[0] != '\0') {
            local_4c8 = (double)CONCAT44(local_478._12_4_,local_478._8_4_);
            local_4b8 = (double)CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                         aStack_468._M_allocated_capacity._0_4_);
            dVar4 = (double)CONCAT44(aStack_468._12_4_,aStack_468._8_4_);
            goto LAB_0032621d;
          }
          if (local_220._M_string_length == 0) {
            local_498 = &local_488;
            local_288 = (undefined1  [4])0x2b;
            auStack_284._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
            auVar47 = ::std::__cxx11::string::_M_create((ulong *)&local_498,(ulong)local_288);
            local_498 = auVar47._0_8_;
            pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(auStack_284._0_4_,local_288);
            local_498->_M_allocated_capacity = 0x20736920607d7b60;
            *(undefined8 *)((long)local_498 + 8) = 0x666c616820746f6e;
            local_498[1]._M_allocated_capacity = 0x74616f6c66202c33;
            builtin_strncpy((char *)((long)local_498 + 0x18),"3 or dou",8);
            builtin_strncpy((char *)((long)local_498 + 0x1b),"r double",8);
            *(char *)((long)local_498 + 0x23) = '3';
            *(char *)((long)local_498 + 0x24) = ' ';
            *(char *)((long)local_498 + 0x25) = 't';
            *(char *)((long)local_498 + 0x26) = 'y';
            *(char *)((long)local_498 + 0x27) = 'p';
            *(char *)((long)local_498 + 0x28) = 'e';
            *(char *)((long)local_498 + 0x29) = '.';
            *(char *)((long)local_498 + 0x2a) = '\n';
            *(char *)((long)&(pbVar28 + -1)[1]._M_dataplus._M_p + (long)local_498->_M_local_buf) =
                 '\0';
            local_490 = pbVar28;
            local_488._M_allocated_capacity = (size_type)pbVar28;
            tinyusdz::to_string_abi_cxx11_((string *)local_288,(tinyusdz *)local_228,auVar47._8_8_);
            fmt::format<std::__cxx11::string>
                      ((string *)local_2f0,(fmt *)&local_498,(string *)local_288,pbVar28);
            puVar6 = (undefined1 *)CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0]));
            puVar24 = local_2f0 + 0x10;
            if (puVar6 == puVar24) {
              aStack_468._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_2f0._19_5_,CONCAT21(local_2f0._17_2_,local_2f0[0x10]))
              ;
              aStack_468._8_4_ = local_2f0._24_4_;
              aStack_468._12_4_ = local_2f0._28_4_;
              local_478._M_local_buf[0] = uVar10;
              local_478._M_local_buf[1] = uVar12;
              local_478._M_allocated_capacity._2_2_ = uVar14;
              local_478._M_allocated_capacity._4_2_ = uVar16;
              local_478._M_allocated_capacity._6_2_ = uVar18;
            }
            else {
              local_478._M_local_buf[0] = local_2f0[0];
              local_478._M_local_buf[1] = (char)local_2f0._1_2_;
              local_478._M_allocated_capacity._2_2_ = (undefined2)((ulong)puVar6 >> 0x10);
              local_478._M_allocated_capacity._4_2_ = SUB52(local_2f0._3_5_,1);
              local_478._M_allocated_capacity._6_2_ = SUB52(local_2f0._3_5_,3);
              aStack_468._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_2f0._19_5_,CONCAT21(local_2f0._17_2_,local_2f0[0x10]))
              ;
            }
            aStack_468._M_allocated_capacity._4_4_ = SUB54(local_2f0._19_5_,1);
            puVar6 = auStack_390 + 8;
            uVar25 = CONCAT53(local_2f0._11_5_,local_2f0._8_3_);
            local_2f0[0] = SUB81(puVar24,0);
            local_2f0._1_2_ = (undefined2)((ulong)puVar24 >> 8);
            local_2f0._3_5_ = (undefined5)((ulong)puVar24 >> 0x18);
            local_2f0._8_3_ = 0;
            local_2f0._11_5_ = 0;
            local_2f0[0x10] = '\0';
            local_318 = false;
            local_398[0] = SUB81(puVar6,0);
            local_398[1] = (undefined1)((ulong)puVar6 >> 8);
            local_398._2_2_ = (undefined2)((ulong)puVar6 >> 0x10);
            stack0xfffffffffffffc6c = (undefined4)((ulong)puVar6 >> 0x20);
            args = (uint *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0]))));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)args == &aStack_468) goto LAB_00327923;
LAB_00327488:
            local_398[0] = SUB81(args,0);
            local_398[1] = (undefined1)((ulong)args >> 8);
            local_398._2_2_ = (undefined2)((ulong)args >> 0x10);
            stack0xfffffffffffffc6c = (undefined4)((ulong)args >> 0x20);
            args = (uint *)CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                                    aStack_468._M_allocated_capacity._0_4_);
            abStack_388[0]._M_dataplus._M_p._0_4_ = aStack_468._M_allocated_capacity._0_4_;
            abStack_388[0]._M_dataplus._M_p._4_4_ = aStack_468._M_allocated_capacity._4_4_;
          }
          else {
            local_498 = &local_488;
            local_288 = (undefined1  [4])0x2e;
            auStack_284._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
            auVar47 = ::std::__cxx11::string::_M_create((ulong *)&local_498,(ulong)local_288);
            local_498 = auVar47._0_8_;
            local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(auStack_284._0_4_,local_288);
            local_498->_M_allocated_capacity = 0x20607d7b3a7d7b60;
            *(undefined8 *)((long)local_498 + 8) = 0x6820746f6e207369;
            local_498[1]._M_allocated_capacity = 0x6c66202c33666c61;
            builtin_strncpy((char *)((long)local_498 + 0x18),"oat3 or ",8);
            builtin_strncpy((char *)((long)local_498 + 0x1e),"r double",8);
            *(char *)((long)local_498 + 0x26) = '3';
            *(char *)((long)local_498 + 0x27) = ' ';
            *(char *)((long)local_498 + 0x28) = 't';
            *(char *)((long)local_498 + 0x29) = 'y';
            *(char *)((long)local_498 + 0x2a) = 'p';
            *(char *)((long)local_498 + 0x2b) = 'e';
            *(char *)((long)local_498 + 0x2c) = '.';
            *(char *)((long)local_498 + 0x2d) = '\n';
            *(char *)((long)&(local_490 + -1)[1]._M_dataplus._M_p + (long)local_498->_M_local_buf) =
                 '\0';
            local_488._M_allocated_capacity = (size_type)local_490;
            tinyusdz::to_string_abi_cxx11_((string *)local_288,(tinyusdz *)local_228,auVar47._8_8_);
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_2f0,(fmt *)&local_498,(string *)local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_228 + 8),args_1);
            puVar6 = (undefined1 *)CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0]));
            puVar24 = local_2f0 + 0x10;
            if (puVar6 == puVar24) {
              aStack_468._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_2f0._19_5_,CONCAT21(local_2f0._17_2_,local_2f0[0x10]))
              ;
              aStack_468._8_4_ = local_2f0._24_4_;
              aStack_468._12_4_ = local_2f0._28_4_;
              local_478._M_local_buf[0] = uVar10;
              local_478._M_local_buf[1] = uVar12;
              local_478._M_allocated_capacity._2_2_ = uVar14;
              local_478._M_allocated_capacity._4_2_ = uVar16;
              local_478._M_allocated_capacity._6_2_ = uVar18;
            }
            else {
              local_478._M_local_buf[0] = local_2f0[0];
              local_478._M_local_buf[1] = (char)local_2f0._1_2_;
              local_478._M_allocated_capacity._2_2_ = (undefined2)((ulong)puVar6 >> 0x10);
              local_478._M_allocated_capacity._4_2_ = SUB52(local_2f0._3_5_,1);
              local_478._M_allocated_capacity._6_2_ = SUB52(local_2f0._3_5_,3);
              aStack_468._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_2f0._19_5_,CONCAT21(local_2f0._17_2_,local_2f0[0x10]))
              ;
            }
            aStack_468._M_allocated_capacity._4_4_ = SUB54(local_2f0._19_5_,1);
            puVar6 = auStack_390 + 8;
            uVar25 = CONCAT53(local_2f0._11_5_,local_2f0._8_3_);
            local_2f0[0] = SUB81(puVar24,0);
            local_2f0._1_2_ = (undefined2)((ulong)puVar24 >> 8);
            local_2f0._3_5_ = (undefined5)((ulong)puVar24 >> 0x18);
            local_2f0._8_3_ = 0;
            local_2f0._11_5_ = 0;
            local_2f0[0x10] = '\0';
            local_318 = false;
            local_398[0] = SUB81(puVar6,0);
            local_398[1] = (undefined1)((ulong)puVar6 >> 8);
            local_398._2_2_ = (undefined2)((ulong)puVar6 >> 0x10);
            stack0xfffffffffffffc6c = (undefined4)((ulong)puVar6 >> 0x20);
            args = (uint *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                                    CONCAT24(local_478._M_allocated_capacity._4_2_,
                                             CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                      CONCAT11(local_478._M_local_buf[1],
                                                               local_478._M_local_buf[0]))));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)args != &aStack_468) goto LAB_00327488;
LAB_00327923:
            abStack_388[0]._M_dataplus._M_p._0_4_ = aStack_468._M_allocated_capacity._0_4_;
            abStack_388[0]._M_dataplus._M_p._4_4_ = aStack_468._M_allocated_capacity._4_4_;
            abStack_388[0]._M_string_length = CONCAT44(aStack_468._12_4_,aStack_468._8_4_);
          }
          abStack_388[0]._M_dataplus._M_p._0_4_ = aStack_468._M_allocated_capacity._0_4_;
          local_2f0._11_5_ = 0;
          local_2f0._8_3_ = 0;
          local_2f0[0x10] = '\0';
          local_318 = false;
          auStack_390._0_2_ = (undefined2)uVar25;
          auStack_390._2_2_ = (undefined2)((ulong)uVar25 >> 0x10);
          auStack_390._4_4_ = (undefined4)((ulong)uVar25 >> 0x20);
          local_478._8_4_ = 0.0;
          local_478._12_4_ = 0.0;
          aStack_468._M_allocated_capacity._0_4_ =
               aStack_468._M_allocated_capacity._0_4_ & 0xffffff00;
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          abStack_388[0]._M_dataplus._M_p._4_4_ = aStack_468._M_allocated_capacity._4_4_;
          if ((undefined1 *)CONCAT44(auStack_284._0_4_,local_288) != auStack_284 + 0xc) {
            operator_delete((undefined1 *)CONCAT44(auStack_284._0_4_,local_288),
                            CONCAT44(auStack_284._16_4_,auStack_284._12_4_) + 1);
          }
          uVar25 = local_488._M_allocated_capacity;
          paVar27 = local_498;
          if (local_498 != &local_488) goto LAB_0032684e;
          goto LAB_00326856;
        }
        fVar40 = tinyusdz::value::half_to_float((half)local_478._M_allocated_capacity._2_2_);
        local_4c8 = (double)fVar40;
        fVar40 = tinyusdz::value::half_to_float((half)uVar13);
        local_4b8 = (double)fVar40;
        fVar40 = tinyusdz::value::half_to_float((half)uVar15);
        dVar4 = (double)fVar40;
LAB_0032621d:
        bVar38 = local_228[4];
        dVar5 = -dVar4;
        local_478._8_4_ = 0.0;
        local_478._12_4_ = 0.0;
        aStack_468._M_allocated_capacity._0_4_ = aStack_468._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        uStack_3e8 = 0;
        local_3e0 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        local_408 = 0;
        uStack_400 = 0;
        local_418 = 0;
        uStack_410 = 0;
        local_428 = 0;
        uStack_420 = 0;
        uStack_438 = 0;
        uStack_434 = 0;
        local_430 = 0;
        uStack_448 = 0;
        uStack_444 = 0;
        local_440 = 0;
        uStack_43c = 0;
        uStack_458 = 0;
        uStack_454 = 0;
        uStack_450 = 0;
        uStack_44c = 0;
        args = (uint *)0x20;
        do {
          pcVar1 = local_478._M_local_buf + (long)args;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = -0x10;
          pcVar1[7] = '?';
          args = (uint *)((long)args + 0x28);
        } while (args != (uint *)0xc0);
        if (bVar38 != false) {
          local_4b8 = -local_4b8;
          local_4c8 = -local_4c8;
          puVar26 = &switchD_0032632d::switchdataD_003c7c38;
          dVar4 = dVar5;
          switch(local_228._0_4_) {
          case 6:
            goto switchD_0032632d_caseD_6;
          case 7:
            goto switchD_0032632d_caseD_7;
          case 8:
            goto switchD_0032632d_caseD_8;
          case 9:
            goto switchD_0032632d_caseD_9;
          case 10:
            goto switchD_0032632d_caseD_a;
          case 0xb:
            goto switchD_0032632d_caseD_b;
          default:
            goto switchD_0032632d_default;
          }
        }
        puVar26 = &switchD_00326349::switchdataD_003c7c20;
        switch(local_228._0_4_) {
        case 6:
          goto switchD_0032632d_caseD_b;
        case 7:
switchD_0032632d_caseD_9:
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,local_4c8);
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
          args = puVar26;
          break;
        case 8:
switchD_0032632d_caseD_a:
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,local_4b8);
          anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,local_4c8);
          args = puVar26;
          goto LAB_003266b1;
        case 9:
switchD_0032632d_caseD_7:
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,local_4b8);
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
          args = puVar26;
          goto LAB_00326824;
        case 10:
switchD_0032632d_caseD_8:
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
          anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,local_4c8);
          args = puVar26;
          break;
        case 0xb:
switchD_0032632d_caseD_6:
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
          anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,local_4b8);
          args = puVar26;
LAB_00326824:
          anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,local_4c8);
          goto LAB_00326831;
        default:
switchD_0032632d_default:
          local_2f0[0] = true;
          local_2f0._1_2_ = 0x3c80;
          local_2f0._3_5_ = 0;
          local_478._M_local_buf[0] = uVar10;
          local_478._M_local_buf[1] = uVar12;
          local_478._M_allocated_capacity._2_2_ = uVar14;
          local_478._M_allocated_capacity._4_2_ = uVar16;
          local_478._M_allocated_capacity._6_2_ = uVar18;
          nonstd::expected_lite::
          expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_398,(unexpected_type<const_char_*> *)local_2f0);
          goto LAB_0032683c;
        }
        anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,local_4b8);
LAB_00326831:
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_398,paVar27);
LAB_0032683c:
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT26(local_478._M_allocated_capacity._6_2_,
                              CONCAT24(local_478._M_allocated_capacity._4_2_,
                                       CONCAT22(local_478._M_allocated_capacity._2_2_,
                                                CONCAT11(local_478._M_local_buf[1],
                                                         local_478._M_local_buf[0]))));
        if (paVar27 != &aStack_468) {
          uVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(aStack_468._M_allocated_capacity._4_4_,
                            aStack_468._M_allocated_capacity._0_4_);
LAB_0032684e:
          operator_delete(paVar27,(ulong)((long)&(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar25)->_M_dataplus)._M_p + 1));
        }
LAB_00326856:
        uVar30 = local_318;
        if (local_318 == false) {
          ::std::__cxx11::string::_M_append
                    ((char *)err,
                     CONCAT44(stack0xfffffffffffffc6c,
                              CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0]))));
        }
        else {
          pdVar23 = (double *)local_398;
          pdVar36 = local_1a8;
          for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
            *pdVar36 = *pdVar23;
            pdVar23 = pdVar23 + (ulong)bVar39 * -2 + 1;
            pdVar36 = pdVar36 + (ulong)bVar39 * -2 + 1;
          }
          args = (uint *)0x0;
        }
        if ((local_318 == false) &&
           (paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(stack0xfffffffffffffc6c,
                                  CONCAT22(local_398._2_2_,CONCAT11(local_398[1],local_398[0]))),
           paVar27 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(auStack_390 + 8))) {
          lVar22 = CONCAT44(abStack_388[0]._M_dataplus._M_p._4_4_,
                            abStack_388[0]._M_dataplus._M_p._0_4_);
LAB_003272f0:
          operator_delete(paVar27,lVar22 + 1);
        }
LAB_003272f8:
        if (uVar30 == '\0') break;
LAB_00327300:
        tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
                  ((matrix4d *)&local_478,(value *)local_1a8,&local_b8,(matrix4d *)args);
        paVar27 = &local_478;
        pmVar35 = &local_b8;
        for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
          pmVar35->m[0][0] = (double)paVar27->_M_allocated_capacity;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar27->_M_allocated_capacity + (ulong)bVar39 * -2 + 1);
          pmVar35 = (matrix4d *)((long)pmVar35 + ((ulong)bVar39 * -2 + 1) * 8);
        }
        bVar38 = true;
        goto LAB_00327b59;
      case 0xc:
        local_478._M_local_buf[0] = '\0';
        local_478._M_local_buf[1] = '\0';
        local_478._M_allocated_capacity._2_2_ = 0;
        local_478._M_allocated_capacity._4_2_ = 0;
        local_478._M_allocated_capacity._6_2_ = 0x3ff0;
        aStack_468._8_4_ = 0;
        aStack_468._12_4_ = 0;
        local_478._8_4_ = 0.0;
        local_478._12_4_ = 0.0;
        aStack_468._M_allocated_capacity._0_4_ = 0;
        aStack_468._M_allocated_capacity._4_4_ = 0;
        uStack_458 = 0;
        uStack_454 = 0x3ff00000;
        local_440 = 0;
        uStack_43c = 0;
        uStack_450 = 0;
        uStack_44c = 0;
        uStack_448 = 0;
        uStack_444 = 0;
        uStack_438 = 0;
        uStack_434 = 0x3ff00000;
        XformOp::get_value<tinyusdz::value::quath>
                  ((optional<tinyusdz::value::quath> *)local_398,(XformOp *)local_228,t,tinterp);
        local_1b2 = local_398[0];
        if (local_398[0] == '\x01') {
          local_1b0.imag._M_elems[1].value = local_398._4_2_;
          local_1b0.imag._M_elems[2].value = stack0xfffffffffffffc6e;
          local_1b0.imag._M_elems[0].value = local_398._2_2_;
          local_1b0.real.value = auStack_390._0_2_;
          to_matrix3x3((matrix3d *)paVar27,&local_1b0);
LAB_003279d1:
          bVar38 = true;
        }
        else {
          XformOp::get_value<tinyusdz::value::quatf>
                    ((optional<tinyusdz::value::quatf> *)local_398,(XformOp *)local_228,t,tinterp);
          local_288[0] = local_398[0];
          if (local_398[0] == '\x01') {
            auStack_284._0_4_ = stack0xfffffffffffffc6c;
            auStack_284._4_4_ =
                 (undefined4)
                 (CONCAT26(auStack_390._2_2_,CONCAT24(auStack_390._0_2_,stack0xfffffffffffffc6c)) >>
                 0x20);
            auStack_284._8_4_ = auStack_390._4_4_;
            auStack_284._12_4_ = abStack_388[0]._M_dataplus._M_p._0_4_;
            to_matrix3x3((matrix3d *)paVar27,(quatf *)auStack_284);
            goto LAB_003279d1;
          }
          XformOp::get_value<tinyusdz::value::quatd>
                    ((optional<tinyusdz::value::quatd> *)local_2f0,(XformOp *)local_228,t,tinterp);
          bVar38 = local_2f0[0];
          local_398[0] = local_2f0[0];
          if (local_2f0[0] == true) {
            abStack_388[0]._M_string_length = CONCAT44(local_2f0._28_4_,local_2f0._24_4_);
            abStack_388[0].field_2._4_4_ = local_2f0._36_4_;
            abStack_388[0].field_2._0_4_ = local_2f0._32_4_;
            auStack_390._0_2_ = (undefined2)local_2f0._8_3_;
            auStack_390._2_2_ = (undefined2)(CONCAT53(local_2f0._11_5_,local_2f0._8_3_) >> 0x10);
            auStack_390._4_4_ = SUB54(local_2f0._11_5_,1);
            abStack_388[0]._M_dataplus._M_p._0_4_ =
                 (undefined4)CONCAT53(local_2f0._19_5_,CONCAT21(local_2f0._17_2_,local_2f0[0x10]));
            abStack_388[0]._M_dataplus._M_p._4_4_ = SUB54(local_2f0._19_5_,1);
            to_matrix3x3((matrix3d *)paVar27,(quatd *)auStack_390);
          }
          else if (err != (string *)0x0) {
            if (local_220._M_string_length == 0) {
              ::std::__cxx11::string::append((char *)err);
            }
            else {
              local_498 = &local_488;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_498,
                         "`xformOp:orient:{}` is not quath, quatf or quatd type.\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_2f0,(fmt *)&local_498,(string *)(local_228 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              ::std::__cxx11::string::_M_append
                        ((char *)err,
                         CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0])));
              puVar24 = (undefined1 *)
                        CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0]));
              if (puVar24 != local_2f0 + 0x10) {
                operator_delete(puVar24,CONCAT53(local_2f0._19_5_,
                                                 CONCAT21(local_2f0._17_2_,local_2f0[0x10])) + 1);
              }
              if (local_498 != &local_488) {
                operator_delete(local_498,(ulong)(local_488._M_allocated_capacity + 1));
              }
            }
          }
          if (bVar38 != false) goto LAB_003279d1;
          bVar38 = false;
        }
        if (bVar38) {
          if (local_228[4] == true) {
            local_398[0] = 0;
            local_398[1] = 0;
            local_398._2_2_ = 0;
            stack0xfffffffffffffc6c = (anon_struct_4_0_00000001_for___align)0x3ff00000;
            pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            abStack_388[0]._M_string_length = 0;
            auStack_390._0_2_ = 0;
            auStack_390._2_2_ = 0;
            auStack_390._4_4_ = 0;
            abStack_388[0]._M_dataplus._M_p._0_4_ = 0;
            abStack_388[0]._M_dataplus._M_p._4_4_ = 0;
            abStack_388[0].field_2._0_8_ = 1.0;
            abStack_388[1]._M_string_length = 0;
            abStack_388[0].field_2._8_8_ = 0.0;
            abStack_388[1]._M_dataplus._M_p = (pointer)0x0;
            abStack_388[1].field_2._0_8_ = 1.0;
            bVar21 = inverse((matrix3d *)paVar27,(matrix3d *)local_398,0.0);
            if ((err != (string *)0x0) && (!bVar21)) {
              if (local_220._M_string_length == 0) {
                ::std::__cxx11::string::append((char *)err);
              }
              else {
                local_498 = &local_488;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_498,
                           "`xformOp:orient:{}` is singular and cannot be inverted.\n","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_2f0,(fmt *)&local_498,(string *)(local_228 + 8),pbVar28);
                ::std::__cxx11::string::_M_append
                          ((char *)err,
                           CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0])));
                puVar24 = (undefined1 *)
                          CONCAT53(local_2f0._3_5_,CONCAT21(local_2f0._1_2_,local_2f0[0]));
                if (puVar24 != local_2f0 + 0x10) {
                  operator_delete(puVar24,CONCAT53(local_2f0._19_5_,
                                                   CONCAT21(local_2f0._17_2_,local_2f0[0x10])) + 1);
                }
                if (local_498 != &local_488) {
                  operator_delete(local_498,(ulong)(local_488._M_allocated_capacity + 1));
                }
              }
            }
            psVar34 = (size_type *)local_398;
            paVar37 = paVar27;
            for (args = (uint *)0x9;
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                args = (uint *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)args + -0x20))->field_2 + 0xf)) {
              paVar37->_M_allocated_capacity = *psVar34;
              psVar34 = psVar34 + (ulong)bVar39 * -2 + 1;
              paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar37 + (ulong)bVar39 * -0x10 + 8);
            }
          }
          local_398[0] = '\0';
          local_398[1] = 0;
          local_398._2_2_ = 0;
          stack0xfffffffffffffc6c = (anon_struct_4_0_00000001_for___align)0x0;
          auStack_390._0_2_ = 0;
          auStack_390._2_2_ = 0;
          auStack_390._4_4_ = 0;
          abStack_388[0]._M_dataplus._M_p._0_4_ = 0;
          abStack_388[0]._M_dataplus._M_p._4_4_ = 0;
          to_matrix((matrix3d *)paVar27,(double3 *)local_398);
          if (bVar38) goto LAB_00327300;
        }
        break;
      case 0xd:
        if (local_230 != 0) {
          local_478._M_local_buf[0] = uVar30;
          local_478._M_local_buf[1] = uVar11;
          local_478._M_allocated_capacity._2_2_ = uVar13;
          local_478._M_allocated_capacity._4_2_ = uVar15;
          local_478._M_allocated_capacity._6_2_ = uVar17;
          if (err != (string *)0x0) {
            ::std::__cxx11::string::append((char *)err);
          }
          break;
        }
        local_478._M_local_buf[0] = uVar30;
        local_478._M_local_buf[1] = uVar11;
        local_478._M_allocated_capacity._2_2_ = uVar13;
        local_478._M_allocated_capacity._4_2_ = uVar15;
        local_478._M_allocated_capacity._6_2_ = uVar17;
        if (local_d8 != (bool *)0x0) {
          *local_d8 = true;
        }
        goto LAB_00327300;
      }
      bVar38 = false;
LAB_00327b59:
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)(local_228 + 0x48));
      if (local_1f0 != (vtable_type *)0x0) {
        (*local_1f0->destroy)((storage_union *)(local_228 + 0x28));
        local_1f0 = (vtable_type *)0x0;
      }
      if (local_220._M_dataplus._M_p != local_228 + 0x18) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if (!bVar38) {
        return local_4d1;
      }
      uVar29 = local_230 + 1;
      pXVar31 = (local_238->xformOps).
                super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      resetXformStack = (bool *)0x6db6db6db6db6db7;
      bVar38 = uVar29 < (ulong)(((long)(local_238->xformOps).
                                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pXVar31 >>
                                4) * 0x6db6db6db6db6db7);
      local_4d1 = !bVar38;
    } while (bVar38);
  }
  pmVar35 = &local_b8;
  for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
    local_d0->m[0][0] = pmVar35->m[0][0];
    pmVar35 = (matrix4d *)((long)pmVar35 + ((ulong)bVar39 * -2 + 1) * 8);
    local_d0 = (matrix4d *)((long)local_d0 + ((ulong)bVar39 * -2 + 1) * 8);
  }
  return local_4d1;
switchD_0032632d_caseD_b:
  local_478._M_local_buf[0] = uVar10;
  local_478._M_local_buf[1] = uVar12;
  local_478._M_allocated_capacity._2_2_ = uVar14;
  local_478._M_allocated_capacity._4_2_ = uVar16;
  local_478._M_allocated_capacity._6_2_ = uVar18;
  anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)paVar27,local_4c8);
  anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)paVar27,local_4b8);
  args = puVar26;
LAB_003266b1:
  anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)paVar27,dVar4);
  goto LAB_00326831;
}

Assistant:

bool Xformable::EvaluateXformOps(double t,
                                 value::TimeSampleInterpolationType tinterp,
                                 value::matrix4d *out_matrix,
                                 bool *resetXformStack,
                                 std::string *err) const {
  const auto RotateABC =
      [t, tinterp](const XformOp &x) -> nonstd::expected<value::matrix4d, std::string> {
    value::double3 v;
    if (auto h = x.get_value<value::half3>(t, tinterp)) {
      v[0] = double(half_to_float(h.value()[0]));
      v[1] = double(half_to_float(h.value()[1]));
      v[2] = double(half_to_float(h.value()[2]));
    } else if (auto f = x.get_value<value::float3>(t, tinterp)) {
      v[0] = double(f.value()[0]);
      v[1] = double(f.value()[1]);
      v[2] = double(f.value()[2]);
    } else if (auto d = x.get_value<value::double3>(t, tinterp)) {
      v = d.value();
    } else {
      if (x.suffix.empty()) {
        return nonstd::make_unexpected(
            fmt::format("`{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type)));
      } else {
        return nonstd::make_unexpected(
            fmt::format("`{}:{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type), x.suffix));
      }
    }

    // invert input, and compute concatenated matrix
    // inv(ABC) = inv(A) x inv(B) x inv(C)
    // as done in pxrUSD.

    if (x.inverted) {
      v[0] = -v[0];
      v[1] = -v[1];
      v[2] = -v[2];
    }

    double xAngle = v[0];
    double yAngle = v[1];
    double zAngle = v[2];

    XformEvaluator eval;

    DCOUT("angles = " << xAngle << ", " << yAngle << ", " << zAngle);
    if (x.inverted) {
      DCOUT("!inverted!\n");
      if (x.op_type == XformOp::OpType::RotateXYZ) {
        // TODO: Apply defined switch for all Rotate*** op.
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    } else {
      if (x.op_type == XformOp::OpType::RotateXYZ) {

#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    }

    return eval.result();
  };

  // Concat matrices
  //
  // Matrix concatenation ordering is its appearance order(right to left)
  // This is same with a notation in math equation: i.e,
  //
  // xformOpOrder = [A, B, C]
  //
  // M = A x B x C
  //
  // p' = A x B x C x p
  //
  // in post-multiply order.
  //
  // But in pre-multiply order system(pxrUSD and TinyUSDZ),
  // C++ code is
  //
  // p' = p x C x B x A
  //
  //
  value::matrix4d cm;
  Identity(&cm);

  for (size_t i = 0; i < xformOps.size(); i++) {
    const auto x = xformOps[i];

    value::matrix4d m;  // local matrix
    Identity(&m);

    switch (x.op_type) {
      case XformOp::OpType::ResetXformStack: {
        if (i != 0) {
          if (err) {
            (*err) +=
                "!resetXformStack! should only appear at the first element of "
                "xformOps\n";
          }
          return false;
        }

        // Notify resetting previous(parent node's) matrices
        if (resetXformStack) {
          (*resetXformStack) = true;
        }
        break;
      }
      case XformOp::OpType::Transform: {
        if (auto sxf = x.get_value<value::matrix4f>(t, tinterp)) {
          value::matrix4f mf = sxf.value();
          for (size_t j = 0; j < 4; j++) {
            for (size_t k = 0; k < 4; k++) {
              m.m[j][k] = double(mf.m[j][k]);
            }
          }
        } else if (auto sxd = x.get_value<value::matrix4d>(t, tinterp)) {
          m = sxd.value();
        } else {
          if (err) {
            (*err) += "`xformOp:transform` is not matrix4f or matrix4d type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // Singular check.
          // pxrUSD uses 1e-9
          double det = determinant(m);

          if (std::fabs(det) < 1e-9) {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:transform` is singular matrix and cannot be "
                    "inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:transform:{}` is singular matrix and cannot be "
                    "inverted.\n",
                    x.suffix);
              }
            }

            return false;
          }

          m = inverse(m);
        }

        break;
      }
      case XformOp::OpType::Scale: {
        double sx, sy, sz;

        if (auto sxh = x.get_value<value::half3>(t, tinterp)) {
          sx = double(half_to_float(sxh.value()[0]));
          sy = double(half_to_float(sxh.value()[1]));
          sz = double(half_to_float(sxh.value()[2]));
        } else if (auto sxf = x.get_value<value::float3>(t, tinterp)) {
          sx = double(sxf.value()[0]);
          sy = double(sxf.value()[1]);
          sz = double(sxf.value()[2]);
        } else if (auto sxd = x.get_value<value::double3>(t, tinterp)) {
          sx = sxd.value()[0];
          sy = sxd.value()[1];
          sz = sxd.value()[2];
        } else {
          if (err) {
            (*err) += "`xformOp:scale` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // FIXME: Safe division
          sx = 1.0 / sx;
          sy = 1.0 / sy;
          sz = 1.0 / sz;
        }

        m.m[0][0] = sx;
        m.m[1][1] = sy;
        m.m[2][2] = sz;

        break;
      }
      case XformOp::OpType::Translate: {
        double tx, ty, tz;
        if (auto txh = x.get_value<value::half3>(t, tinterp)) {
          tx = double(half_to_float(txh.value()[0]));
          ty = double(half_to_float(txh.value()[1]));
          tz = double(half_to_float(txh.value()[2]));
        } else if (auto txf = x.get_value<value::float3>(t, tinterp)) {
          tx = double(txf.value()[0]);
          ty = double(txf.value()[1]);
          tz = double(txf.value()[2]);
        } else if (auto txd = x.get_value<value::double3>(t, tinterp)) {
          tx = txd.value()[0];
          ty = txd.value()[1];
          tz = txd.value()[2];
        } else {
          if (err) {
            (*err) +=
                "`xformOp:translate` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          tx = -tx;
          ty = -ty;
          tz = -tz;
        }

        m.m[3][0] = tx;
        m.m[3][1] = ty;
        m.m[3][2] = tz;

        break;
      }
      // FIXME: Validate ROTATE_X, _Y, _Z implementation
      case XformOp::OpType::RotateX: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateX` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateX:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({1.0, 0.0, 0.0}, angle);
#else
        xe.RotateX(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateY: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateY` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateY:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 1.0, 0.0}, angle);
#else
        xe.RotateY(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateZ: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateZ` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateZ:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 0.0, 1.0}, angle);
#else
        xe.RotateZ(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::Orient: {
        // value::quat stores elements in (x, y, z, w)
        // linalg::quat also stores elements in (x, y, z, w)

        value::matrix3d rm;
        if (auto h = x.get_value<value::quath>(t, tinterp)) {
          rm = to_matrix3x3(h.value());
        } else if (auto f = x.get_value<value::quatf>(t, tinterp)) {
          rm = to_matrix3x3(f.value());
        } else if (auto d = x.get_value<value::quatd>(t, tinterp)) {
          rm = to_matrix3x3(d.value());
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) += "`xformOp:orient` is not quath, quatf or quatd type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        // FIXME: invert before getting matrix.
        if (x.inverted) {
          value::matrix3d inv_rm;
          if (inverse(rm, inv_rm)) {
          } else {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:orient` is singular and cannot be inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:orient:{}` is singular and cannot be inverted.\n",
                    x.suffix);
              }
            }
          }

          rm = inv_rm;
        }

        m = to_matrix(rm, {0.0, 0.0, 0.0});

        break;
      }

      case XformOp::OpType::RotateXYZ:
      case XformOp::OpType::RotateXZY:
      case XformOp::OpType::RotateYXZ:
      case XformOp::OpType::RotateYZX:
      case XformOp::OpType::RotateZXY:
      case XformOp::OpType::RotateZYX: {
        auto ret = RotateABC(x);

        if (!ret) {
          (*err) += ret.error();
          return false;
        }

        m = ret.value();
      }
    }

    cm = m * cm;  // `m` fist for pre-multiply system.
  }

  (*out_matrix) = cm;

  return true;
}